

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O1

void * add234_internal(tree234 *t,void *e,int index)

{
  void *pvVar1;
  bool bVar2;
  int count_1;
  node234 *pnVar3;
  long lVar4;
  node234_conflict *pnVar5;
  ulong uVar6;
  ulong uVar7;
  int count;
  uint uVar8;
  int iVar9;
  tree234 *ptVar10;
  node234_conflict *pnVar11;
  node234_conflict *pnVar12;
  int iVar13;
  node234 *pnVar14;
  void *local_48;
  
  if (t->root == (node234_conflict *)0x0) {
    pnVar5 = (node234_conflict *)safemalloc(1,0x50,0);
    t->root = pnVar5;
    pnVar5->elems[2] = (void *)0x0;
    t->root->elems[1] = (void *)0x0;
    t->root->kids[1] = (node234 *)0x0;
    t->root->kids[0] = (node234 *)0x0;
    t->root->kids[3] = (node234 *)0x0;
    t->root->kids[2] = (node234 *)0x0;
    pnVar5 = t->root;
    pnVar5->parent = (node234_conflict *)0x0;
    pnVar5->counts[0] = 0;
    pnVar5->counts[1] = 0;
    pnVar5->counts[2] = 0;
    pnVar5->counts[3] = 0;
    pnVar5->elems[0] = e;
  }
  else {
    iVar13 = 0;
    ptVar10 = t;
    if (t->root == (node234_conflict *)0x0) {
      pnVar5 = (node234_conflict *)0x0;
    }
    else {
      uVar6 = (ulong)(uint)index;
      pnVar12 = t->root;
      do {
        pnVar5 = pnVar12;
        iVar9 = (int)uVar6;
        if (iVar9 < 0) {
          iVar9 = (*t->cmp)(e,pnVar5->elems[0]);
          if (iVar9 < 0) {
LAB_00163368:
            uVar7 = 0;
          }
          else {
            if (iVar9 == 0) {
              local_48 = pnVar5->elems[0];
              goto LAB_00163398;
            }
            uVar7 = 1;
            if (pnVar5->elems[1] != (void *)0x0) {
              iVar9 = (*t->cmp)(e,pnVar5->elems[1]);
              if (-1 < iVar9) {
                if (iVar9 == 0) {
                  local_48 = pnVar5->elems[1];
LAB_00163398:
                  bVar2 = false;
                  goto LAB_00163378;
                }
                uVar7 = 2;
                if (pnVar5->elems[2] != (void *)0x0) {
                  iVar9 = (*t->cmp)(e,pnVar5->elems[2]);
                  if ((-1 < iVar9) && (uVar7 = 3, iVar9 == 0)) {
                    local_48 = pnVar5->elems[2];
                    goto LAB_00163398;
                  }
                }
              }
            }
          }
LAB_0016336e:
          ptVar10 = (tree234 *)(pnVar5->kids + uVar7);
          bVar2 = true;
        }
        else {
          uVar7 = uVar6;
          if (pnVar5->kids[0] == (node234 *)0x0) goto LAB_0016336e;
          if (iVar9 <= pnVar5->counts[0]) goto LAB_00163368;
          uVar8 = iVar9 + ~pnVar5->counts[0];
          uVar6 = (ulong)uVar8;
          uVar7 = 1;
          if ((int)uVar8 <= pnVar5->counts[1]) goto LAB_0016336e;
          uVar8 = uVar8 + ~pnVar5->counts[1];
          uVar6 = (ulong)uVar8;
          uVar7 = 2;
          if ((int)uVar8 <= pnVar5->counts[2]) goto LAB_0016336e;
          uVar8 = uVar8 + ~pnVar5->counts[2];
          uVar6 = (ulong)uVar8;
          uVar7 = 3;
          if ((int)uVar8 <= pnVar5->counts[3]) goto LAB_0016336e;
          bVar2 = false;
          local_48 = (void *)0x0;
        }
LAB_00163378:
        if (!bVar2) {
          return local_48;
        }
        pnVar12 = ptVar10->root;
      } while (ptVar10->root != (node234_conflict *)0x0);
    }
    local_48 = e;
    if (pnVar5 == (node234_conflict *)0x0) {
      pnVar3 = (node234 *)0x0;
      pnVar12 = (node234_conflict *)0x0;
      iVar9 = 0;
    }
    else {
      iVar9 = 0;
      iVar13 = 0;
      pnVar11 = (node234_conflict *)0x0;
      pnVar14 = (node234 *)0x0;
      do {
        pnVar12 = pnVar5;
        pvVar1 = pnVar12->elems[1];
        if (pvVar1 == (void *)0x0) {
          if (ptVar10 == (tree234 *)pnVar12->kids) {
            pnVar12->kids[2] = pnVar12->kids[1];
            pnVar12->counts[2] = pnVar12->counts[1];
            pnVar12->elems[1] = pnVar12->elems[0];
            pnVar12->kids[1] = pnVar11;
            pnVar12->counts[1] = iVar9;
            pnVar12->elems[0] = local_48;
            pnVar12->kids[0] = pnVar14;
            pnVar12->counts[0] = iVar13;
          }
          else {
            pnVar12->kids[2] = pnVar11;
            pnVar12->counts[2] = iVar9;
            pnVar12->elems[1] = local_48;
            pnVar12->kids[1] = pnVar14;
            pnVar12->counts[1] = iVar13;
          }
          pnVar3 = pnVar12->kids[0];
          if (pnVar3 != (node234 *)0x0) {
            pnVar3->parent = pnVar12;
          }
          if (pnVar12->kids[1] != (node234 *)0x0) {
            pnVar12->kids[1]->parent = pnVar12;
          }
          pnVar3 = pnVar12->kids[2];
LAB_001638d1:
          if (pnVar3 != (node234 *)0x0) {
            pnVar3->parent = pnVar12;
          }
          while (pnVar5 = pnVar12->parent, pnVar5 != (node234_conflict *)0x0) {
            lVar4 = 10;
            iVar13 = 0;
            do {
              iVar13 = iVar13 + *(int *)((long)pnVar12->kids + lVar4 * 4 + -8);
              lVar4 = lVar4 + 1;
            } while (lVar4 != 0xe);
            lVar4 = 7;
            do {
              iVar13 = (iVar13 + 1) - (uint)(pnVar12->kids[lVar4 + -1] == (node234 *)0x0);
              lVar4 = lVar4 + 1;
            } while (lVar4 != 10);
            if (pnVar5->kids[0] == pnVar12) {
              uVar6 = 0;
            }
            else if (pnVar5->kids[1] == pnVar12) {
              uVar6 = 1;
            }
            else {
              uVar6 = (ulong)(pnVar5->kids[2] == pnVar12) ^ 3;
            }
            pnVar5->counts[uVar6] = iVar13;
            pnVar12 = pnVar5;
          }
          return e;
        }
        if (pnVar12->elems[2] == (void *)0x0) {
          if (ptVar10 == (tree234 *)pnVar12->kids) {
            pnVar12->elems[2] = pvVar1;
            pnVar3 = pnVar12->kids[2];
            pnVar12->kids[2] = pnVar12->kids[1];
            pnVar12->kids[3] = pnVar3;
            *(undefined8 *)(pnVar12->counts + 2) = *(undefined8 *)(pnVar12->counts + 1);
            pnVar12->elems[1] = pnVar12->elems[0];
            pnVar12->kids[1] = pnVar11;
            pnVar12->counts[1] = iVar9;
            pnVar12->elems[0] = local_48;
            pnVar12->kids[0] = pnVar14;
            pnVar12->counts[0] = iVar13;
          }
          else if (ptVar10 == (tree234 *)(pnVar12->kids + 1)) {
            pnVar12->kids[3] = pnVar12->kids[2];
            pnVar12->counts[3] = pnVar12->counts[2];
            pnVar12->elems[2] = pvVar1;
            pnVar12->kids[2] = pnVar11;
            pnVar12->counts[2] = iVar9;
            pnVar12->elems[1] = local_48;
            pnVar12->kids[1] = pnVar14;
            pnVar12->counts[1] = iVar13;
          }
          else {
            pnVar12->kids[3] = pnVar11;
            pnVar12->counts[3] = iVar9;
            pnVar12->elems[2] = local_48;
            pnVar12->kids[2] = pnVar14;
            pnVar12->counts[2] = iVar13;
          }
          pnVar3 = pnVar12->kids[0];
          if (pnVar3 != (node234 *)0x0) {
            pnVar3->parent = pnVar12;
          }
          if (pnVar12->kids[1] != (node234 *)0x0) {
            pnVar12->kids[1]->parent = pnVar12;
          }
          if (pnVar12->kids[2] != (node234 *)0x0) {
            pnVar12->kids[2]->parent = pnVar12;
          }
          pnVar3 = pnVar12->kids[3];
          goto LAB_001638d1;
        }
        pnVar3 = (node234 *)safemalloc(1,0x50,0);
        pnVar3->parent = pnVar12->parent;
        if (ptVar10 == (tree234 *)pnVar12->kids) {
          pnVar3->kids[0] = pnVar14;
          pnVar3->counts[0] = iVar13;
          pnVar3->elems[0] = local_48;
          pnVar3->kids[1] = pnVar11;
          pnVar3->counts[1] = iVar9;
          pnVar3->elems[1] = pnVar12->elems[0];
          pnVar3->kids[2] = pnVar12->kids[1];
          pnVar3->counts[2] = pnVar12->counts[1];
LAB_00163569:
          local_48 = pnVar12->elems[1];
          pnVar14 = pnVar12->kids[3];
          pnVar12->kids[0] = pnVar12->kids[2];
          pnVar12->kids[1] = pnVar14;
          *(undefined8 *)pnVar12->counts = *(undefined8 *)(pnVar12->counts + 2);
          pnVar12->elems[0] = pnVar12->elems[2];
        }
        else {
          if (ptVar10 == (tree234 *)(pnVar12->kids + 1)) {
            pnVar3->kids[0] = pnVar12->kids[0];
            pnVar3->counts[0] = pnVar12->counts[0];
            pnVar3->elems[0] = pnVar12->elems[0];
            pnVar3->kids[1] = pnVar14;
            pnVar3->counts[1] = iVar13;
            pnVar3->elems[1] = local_48;
            pnVar3->kids[2] = pnVar11;
            pnVar3->counts[2] = iVar9;
            goto LAB_00163569;
          }
          pnVar3->kids[0] = pnVar12->kids[0];
          pnVar3->counts[0] = pnVar12->counts[0];
          pnVar3->elems[0] = pnVar12->elems[0];
          pnVar3->kids[1] = pnVar12->kids[1];
          pnVar3->counts[1] = pnVar12->counts[1];
          pnVar3->elems[1] = pnVar12->elems[1];
          if (ptVar10 == (tree234 *)(pnVar12->kids + 2)) {
            pnVar3->kids[2] = pnVar14;
            pnVar3->counts[2] = iVar13;
            pnVar12->kids[0] = pnVar11;
            pnVar12->counts[0] = iVar9;
            pnVar12->elems[0] = pnVar12->elems[2];
            pnVar12->kids[1] = pnVar12->kids[3];
            pnVar12->counts[1] = pnVar12->counts[3];
          }
          else {
            pnVar3->kids[2] = pnVar12->kids[2];
            pnVar3->counts[2] = pnVar12->counts[2];
            pnVar12->kids[0] = pnVar14;
            pnVar12->counts[0] = iVar13;
            pnVar12->elems[0] = local_48;
            pnVar12->kids[1] = pnVar11;
            pnVar12->counts[1] = iVar9;
            local_48 = pnVar12->elems[2];
          }
        }
        pnVar12->kids[2] = (node234 *)0x0;
        pnVar12->kids[3] = (node234 *)0x0;
        pnVar3->kids[3] = (node234 *)0x0;
        pnVar12->counts[2] = 0;
        pnVar12->counts[3] = 0;
        pnVar3->counts[3] = 0;
        pnVar12->elems[1] = (void *)0x0;
        pnVar12->elems[2] = (void *)0x0;
        pnVar3->elems[2] = (void *)0x0;
        if (pnVar3->kids[0] != (node234 *)0x0) {
          pnVar3->kids[0]->parent = pnVar3;
        }
        if (pnVar3->kids[1] != (node234 *)0x0) {
          pnVar3->kids[1]->parent = pnVar3;
        }
        if (pnVar3->kids[2] != (node234 *)0x0) {
          pnVar3->kids[2]->parent = pnVar3;
        }
        pnVar14 = pnVar12->kids[0];
        if (pnVar14 != (node234 *)0x0) {
          pnVar14->parent = pnVar12;
        }
        if (pnVar12->kids[1] != (node234 *)0x0) {
          pnVar12->kids[1]->parent = pnVar12;
        }
        iVar9 = 0;
        iVar13 = 0;
        if (pnVar3 != (node234 *)0x0) {
          lVar4 = 0;
          do {
            iVar13 = iVar13 + pnVar3->counts[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          lVar4 = 0;
          do {
            iVar13 = (iVar13 + 1) - (uint)(pnVar3->elems[lVar4] == (void *)0x0);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 3);
        }
        lVar4 = 10;
        do {
          iVar9 = iVar9 + *(int *)((long)pnVar12->kids + lVar4 * 4 + -8);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0xe);
        lVar4 = 7;
        do {
          iVar9 = (iVar9 + 1) - (uint)(pnVar12->kids[lVar4 + -1] == (node234 *)0x0);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 10);
        pnVar5 = pnVar12->parent;
        if (pnVar5 != (node234_conflict *)0x0) {
          if (pnVar5->kids[0] == pnVar12) {
            ptVar10 = (tree234 *)pnVar5->kids;
          }
          else if (pnVar5->kids[1] == pnVar12) {
            ptVar10 = (tree234 *)(pnVar5->kids + 1);
          }
          else {
            ptVar10 = (tree234 *)(pnVar5->kids + 3);
            if (pnVar5->kids[2] == pnVar12) {
              ptVar10 = (tree234 *)(pnVar5->kids + 2);
            }
          }
        }
        pnVar11 = pnVar12;
        pnVar14 = pnVar3;
      } while (pnVar5 != (node234_conflict *)0x0);
    }
    pnVar5 = (node234_conflict *)safemalloc(1,0x50,0);
    t->root = pnVar5;
    pnVar5->kids[0] = pnVar3;
    pnVar5 = t->root;
    pnVar5->counts[0] = iVar13;
    pnVar5->elems[0] = local_48;
    t->root->kids[1] = pnVar12;
    pnVar5 = t->root;
    pnVar5->counts[1] = iVar9;
    pnVar5->elems[1] = (void *)0x0;
    t->root->kids[2] = (node234 *)0x0;
    pnVar5 = t->root;
    pnVar5->counts[2] = 0;
    pnVar5->elems[2] = (void *)0x0;
    t->root->kids[3] = (node234 *)0x0;
    pnVar5 = t->root;
    pnVar5->counts[3] = 0;
    pnVar5->parent = (node234_conflict *)0x0;
    if (pnVar5->kids[0] != (node234 *)0x0) {
      pnVar5->kids[0]->parent = pnVar5;
    }
    if (pnVar5->kids[1] != (node234 *)0x0) {
      pnVar5->kids[1]->parent = pnVar5;
    }
  }
  return e;
}

Assistant:

static void *add234_internal(tree234 * t, void *e, int index)
{
    node234 *n, **np, *left, *right;
    void *orig_e = e;
    int c, lcount, rcount;

    LOG(("adding node %p to tree %p\n", e, t));
    if (t->root == NULL) {
        t->root = snew(node234);
        t->root->elems[1] = t->root->elems[2] = NULL;
        t->root->kids[0] = t->root->kids[1] = NULL;
        t->root->kids[2] = t->root->kids[3] = NULL;
        t->root->counts[0] = t->root->counts[1] = 0;
        t->root->counts[2] = t->root->counts[3] = 0;
        t->root->parent = NULL;
        t->root->elems[0] = e;
        LOG(("  created root %p\n", t->root));
        return orig_e;
    }

    n = NULL; /* placate gcc; will always be set below since t->root != NULL */
    np = &t->root;
    while (*np) {
        int childnum;
        n = *np;
        LOG(("  node %p: %p/%d [%p] %p/%d [%p] %p/%d [%p] %p/%d\n",
             n,
             n->kids[0], n->counts[0], n->elems[0],
             n->kids[1], n->counts[1], n->elems[1],
             n->kids[2], n->counts[2], n->elems[2],
             n->kids[3], n->counts[3]));
        if (index >= 0) {
            if (!n->kids[0]) {
                /*
                 * Leaf node. We want to insert at kid position
                 * equal to the index:
                 *
                 *   0 A 1 B 2 C 3
                 */
                childnum = index;
            } else {
                /*
                 * Internal node. We always descend through it (add
                 * always starts at the bottom, never in the
                 * middle).
                 */
                do {                   /* this is a do ... while (0) to allow `break' */
                    if (index <= n->counts[0]) {
                        childnum = 0;
                        break;
                    }
                    index -= n->counts[0] + 1;
                    if (index <= n->counts[1]) {
                        childnum = 1;
                        break;
                    }
                    index -= n->counts[1] + 1;
                    if (index <= n->counts[2]) {
                        childnum = 2;
                        break;
                    }
                    index -= n->counts[2] + 1;
                    if (index <= n->counts[3]) {
                        childnum = 3;
                        break;
                    }
                    return NULL;       /* error: index out of range */
                } while (0);
            }
        } else {
            if ((c = t->cmp(e, n->elems[0])) < 0)
                childnum = 0;
            else if (c == 0)
                return n->elems[0];    /* already exists */
            else if (n->elems[1] == NULL
                     || (c = t->cmp(e, n->elems[1])) < 0) childnum = 1;
            else if (c == 0)
                return n->elems[1];    /* already exists */
            else if (n->elems[2] == NULL
                     || (c = t->cmp(e, n->elems[2])) < 0) childnum = 2;
            else if (c == 0)
                return n->elems[2];    /* already exists */
            else
                childnum = 3;
        }
        np = &n->kids[childnum];
        LOG(("  moving to child %d (%p)\n", childnum, *np));
    }

    /*
     * We need to insert the new element in n at position np.
     */
    left = NULL;
    lcount = 0;
    right = NULL;
    rcount = 0;
    while (n) {
        LOG(("  at %p: %p/%d [%p] %p/%d [%p] %p/%d [%p] %p/%d\n",
             n,
             n->kids[0], n->counts[0], n->elems[0],
             n->kids[1], n->counts[1], n->elems[1],
             n->kids[2], n->counts[2], n->elems[2],
             n->kids[3], n->counts[3]));
        LOG(("  need to insert %p/%d [%p] %p/%d at position %d\n",
             left, lcount, e, right, rcount, (int)(np - n->kids)));
        if (n->elems[1] == NULL) {
            /*
             * Insert in a 2-node; simple.
             */
            if (np == &n->kids[0]) {
                LOG(("  inserting on left of 2-node\n"));
                n->kids[2] = n->kids[1];
                n->counts[2] = n->counts[1];
                n->elems[1] = n->elems[0];
                n->kids[1] = right;
                n->counts[1] = rcount;
                n->elems[0] = e;
                n->kids[0] = left;
                n->counts[0] = lcount;
            } else {                   /* np == &n->kids[1] */
                LOG(("  inserting on right of 2-node\n"));
                n->kids[2] = right;
                n->counts[2] = rcount;
                n->elems[1] = e;
                n->kids[1] = left;
                n->counts[1] = lcount;
            }
            if (n->kids[0])
                n->kids[0]->parent = n;
            if (n->kids[1])
                n->kids[1]->parent = n;
            if (n->kids[2])
                n->kids[2]->parent = n;
            LOG(("  done\n"));
            break;
        } else if (n->elems[2] == NULL) {
            /*
             * Insert in a 3-node; simple.
             */
            if (np == &n->kids[0]) {
                LOG(("  inserting on left of 3-node\n"));
                n->kids[3] = n->kids[2];
                n->counts[3] = n->counts[2];
                n->elems[2] = n->elems[1];
                n->kids[2] = n->kids[1];
                n->counts[2] = n->counts[1];
                n->elems[1] = n->elems[0];
                n->kids[1] = right;
                n->counts[1] = rcount;
                n->elems[0] = e;
                n->kids[0] = left;
                n->counts[0] = lcount;
            } else if (np == &n->kids[1]) {
                LOG(("  inserting in middle of 3-node\n"));
                n->kids[3] = n->kids[2];
                n->counts[3] = n->counts[2];
                n->elems[2] = n->elems[1];
                n->kids[2] = right;
                n->counts[2] = rcount;
                n->elems[1] = e;
                n->kids[1] = left;
                n->counts[1] = lcount;
            } else {                   /* np == &n->kids[2] */
                LOG(("  inserting on right of 3-node\n"));
                n->kids[3] = right;
                n->counts[3] = rcount;
                n->elems[2] = e;
                n->kids[2] = left;
                n->counts[2] = lcount;
            }
            if (n->kids[0])
                n->kids[0]->parent = n;
            if (n->kids[1])
                n->kids[1]->parent = n;
            if (n->kids[2])
                n->kids[2]->parent = n;
            if (n->kids[3])
                n->kids[3]->parent = n;
            LOG(("  done\n"));
            break;
        } else {
            node234 *m = snew(node234);
            m->parent = n->parent;
            LOG(("  splitting a 4-node; created new node %p\n", m));
            /*
             * Insert in a 4-node; split into a 2-node and a
             * 3-node, and move focus up a level.
             *
             * I don't think it matters which way round we put the
             * 2 and the 3. For simplicity, we'll put the 3 first
             * always.
             */
            if (np == &n->kids[0]) {
                m->kids[0] = left;
                m->counts[0] = lcount;
                m->elems[0] = e;
                m->kids[1] = right;
                m->counts[1] = rcount;
                m->elems[1] = n->elems[0];
                m->kids[2] = n->kids[1];
                m->counts[2] = n->counts[1];
                e = n->elems[1];
                n->kids[0] = n->kids[2];
                n->counts[0] = n->counts[2];
                n->elems[0] = n->elems[2];
                n->kids[1] = n->kids[3];
                n->counts[1] = n->counts[3];
            } else if (np == &n->kids[1]) {
                m->kids[0] = n->kids[0];
                m->counts[0] = n->counts[0];
                m->elems[0] = n->elems[0];
                m->kids[1] = left;
                m->counts[1] = lcount;
                m->elems[1] = e;
                m->kids[2] = right;
                m->counts[2] = rcount;
                e = n->elems[1];
                n->kids[0] = n->kids[2];
                n->counts[0] = n->counts[2];
                n->elems[0] = n->elems[2];
                n->kids[1] = n->kids[3];
                n->counts[1] = n->counts[3];
            } else if (np == &n->kids[2]) {
                m->kids[0] = n->kids[0];
                m->counts[0] = n->counts[0];
                m->elems[0] = n->elems[0];
                m->kids[1] = n->kids[1];
                m->counts[1] = n->counts[1];
                m->elems[1] = n->elems[1];
                m->kids[2] = left;
                m->counts[2] = lcount;
                /* e = e; */
                n->kids[0] = right;
                n->counts[0] = rcount;
                n->elems[0] = n->elems[2];
                n->kids[1] = n->kids[3];
                n->counts[1] = n->counts[3];
            } else {                   /* np == &n->kids[3] */
                m->kids[0] = n->kids[0];
                m->counts[0] = n->counts[0];
                m->elems[0] = n->elems[0];
                m->kids[1] = n->kids[1];
                m->counts[1] = n->counts[1];
                m->elems[1] = n->elems[1];
                m->kids[2] = n->kids[2];
                m->counts[2] = n->counts[2];
                n->kids[0] = left;
                n->counts[0] = lcount;
                n->elems[0] = e;
                n->kids[1] = right;
                n->counts[1] = rcount;
                e = n->elems[2];
            }
            m->kids[3] = n->kids[3] = n->kids[2] = NULL;
            m->counts[3] = n->counts[3] = n->counts[2] = 0;
            m->elems[2] = n->elems[2] = n->elems[1] = NULL;
            if (m->kids[0])
                m->kids[0]->parent = m;
            if (m->kids[1])
                m->kids[1]->parent = m;
            if (m->kids[2])
                m->kids[2]->parent = m;
            if (n->kids[0])
                n->kids[0]->parent = n;
            if (n->kids[1])
                n->kids[1]->parent = n;
            LOG(("  left (%p): %p/%d [%p] %p/%d [%p] %p/%d\n", m,
                 m->kids[0], m->counts[0], m->elems[0],
                 m->kids[1], m->counts[1], m->elems[1],
                 m->kids[2], m->counts[2]));
            LOG(("  right (%p): %p/%d [%p] %p/%d\n", n,
                 n->kids[0], n->counts[0], n->elems[0],
                 n->kids[1], n->counts[1]));
            left = m;
            lcount = countnode234(left);
            right = n;
            rcount = countnode234(right);
        }
        if (n->parent)
            np = (n->parent->kids[0] == n ? &n->parent->kids[0] :
                  n->parent->kids[1] == n ? &n->parent->kids[1] :
                  n->parent->kids[2] == n ? &n->parent->kids[2] :
                  &n->parent->kids[3]);
        n = n->parent;
    }

    /*
     * If we've come out of here by `break', n will still be
     * non-NULL and all we need to do is go back up the tree
     * updating counts. If we've come here because n is NULL, we
     * need to create a new root for the tree because the old one
     * has just split into two. */
    if (n) {
        while (n->parent) {
            int count = countnode234(n);
            int childnum;
            childnum = (n->parent->kids[0] == n ? 0 :
                        n->parent->kids[1] == n ? 1 :
                        n->parent->kids[2] == n ? 2 : 3);
            n->parent->counts[childnum] = count;
            n = n->parent;
        }
    } else {
        LOG(("  root is overloaded, split into two\n"));
        t->root = snew(node234);
        t->root->kids[0] = left;
        t->root->counts[0] = lcount;
        t->root->elems[0] = e;
        t->root->kids[1] = right;
        t->root->counts[1] = rcount;
        t->root->elems[1] = NULL;
        t->root->kids[2] = NULL;
        t->root->counts[2] = 0;
        t->root->elems[2] = NULL;
        t->root->kids[3] = NULL;
        t->root->counts[3] = 0;
        t->root->parent = NULL;
        if (t->root->kids[0])
            t->root->kids[0]->parent = t->root;
        if (t->root->kids[1])
            t->root->kids[1]->parent = t->root;
        LOG(("  new root is %p/%d [%p] %p/%d\n",
             t->root->kids[0], t->root->counts[0],
             t->root->elems[0], t->root->kids[1], t->root->counts[1]));
    }

    return orig_e;
}